

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O0

RecyclableObject * __thiscall
Js::JavascriptLibrary::CreateProxy_TTD
          (JavascriptLibrary *this,RecyclableObject *handler,RecyclableObject *target)

{
  bool bVar1;
  ScriptContext *this_00;
  Recycler *pRVar2;
  JavascriptProxy *this_01;
  DynamicType *pDVar3;
  ScriptContext **ppSVar4;
  TrackAllocData local_50;
  JavascriptProxy *local_28;
  JavascriptProxy *newProxy;
  RecyclableObject *target_local;
  RecyclableObject *handler_local;
  JavascriptLibrary *this_local;
  
  newProxy = (JavascriptProxy *)target;
  target_local = handler;
  handler_local = (RecyclableObject *)this;
  this_00 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                      (&(this->super_JavascriptLibraryBase).scriptContext);
  pRVar2 = ScriptContext::GetRecycler(this_00);
  Memory::TrackAllocData::CreateTrackAllocData
            (&local_50,(type_info *)&Js::JavascriptProxy::typeinfo,0,0xffffffffffffffff,
             "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptLibrary.cpp"
             ,0x15bb);
  pRVar2 = Memory::Recycler::TrackAllocInfo(pRVar2,&local_50);
  this_01 = (JavascriptProxy *)new<Memory::Recycler>(0x30,pRVar2,0x43c4b0);
  pDVar3 = GetProxyType(this);
  ppSVar4 = Memory::WriteBarrierPtr::operator_cast_to_ScriptContext__
                      ((WriteBarrierPtr *)&(this->super_JavascriptLibraryBase).scriptContext);
  Js::JavascriptProxy::JavascriptProxy
            (this_01,pDVar3,*ppSVar4,(RecyclableObject *)newProxy,target_local);
  local_28 = this_01;
  if ((newProxy != (JavascriptProxy *)0x0) &&
     (bVar1 = JavascriptConversion::IsCallable((RecyclableObject *)newProxy), bVar1)) {
    DynamicObject::ChangeType(&local_28->super_DynamicObject);
    pDVar3 = DynamicObject::GetDynamicType(&local_28->super_DynamicObject);
    DynamicType::SetEntryPoint(pDVar3,Js::JavascriptProxy::FunctionCallTrap);
  }
  return (RecyclableObject *)local_28;
}

Assistant:

Js::RecyclableObject* JavascriptLibrary::CreateProxy_TTD(RecyclableObject* handler, RecyclableObject* target)
    {
        JavascriptProxy* newProxy = RecyclerNew(this->scriptContext->GetRecycler(), JavascriptProxy, this->GetProxyType(), this->scriptContext, target, handler);

        if(target != nullptr && JavascriptConversion::IsCallable(target))
        {
            newProxy->ChangeType();
            newProxy->GetDynamicType()->SetEntryPoint(JavascriptProxy::FunctionCallTrap);
        }

        return newProxy;
    }